

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<QString_&,_QString> *b)

{
  ArrayOptions *pAVar1;
  ulong uVar2;
  Data *pDVar3;
  ulong uVar4;
  long lVar5;
  char16_t *pcVar6;
  long lVar7;
  ulong uVar8;
  char16_t *__dest;
  
  pDVar3 = (a->d).d;
  lVar5 = (a->d).size;
  uVar8 = (b->a->d).size + lVar5 + (b->b).d.size;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar5);
    pDVar3 = (a->d).d;
    if (pDVar3 != (Data *)0x0) goto LAB_0026e7c9;
    if (uVar8 != 0) {
      uVar4 = (a->d).size;
      goto LAB_0026e81e;
    }
  }
  else {
LAB_0026e7c9:
    lVar5 = (pDVar3->super_QArrayData).alloc;
    uVar4 = (a->d).size;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar5 - uVar4) - lVar7) < (long)uVar8) {
      uVar2 = lVar5 * 2;
      if (lVar5 * 2 < (long)uVar8) {
        uVar2 = uVar8;
      }
      uVar8 = uVar2;
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar5 - lVar7 <= (long)uVar8)) {
LAB_0026e81e:
        if (uVar8 < uVar4) {
          uVar8 = uVar4;
        }
        QString::reallocData((longlong)a,(AllocationOption)uVar8);
        pDVar3 = (a->d).d;
        if (pDVar3 == (Data *)0x0) goto LAB_0026e84e;
        lVar5 = (pDVar3->super_QArrayData).alloc;
      }
      if (lVar5 != 0) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_0026e85f;
  }
LAB_0026e84e:
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_0026e85f:
  __dest = (a->d).ptr + (a->d).size;
  lVar5 = (b->a->d).size;
  if (lVar5 != 0) {
    pcVar6 = (b->a->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar6,lVar5 * 2);
  }
  lVar7 = (b->b).d.size;
  if (lVar7 != 0) {
    pcVar6 = (b->b).d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest + lVar5,pcVar6,lVar7 * 2);
  }
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}